

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc_manager_direct.cc
# Opt level: O1

void __thiscall
webrtc::AgcManagerDirect::AgcManagerDirect
          (AgcManagerDirect *this,Agc *agc,GainControl *gctrl,VolumeCallbacks *volume_callbacks,
          int startup_min_level)

{
  int iVar1;
  DebugFile *pDVar2;
  pointer *__ptr;
  
  (this->agc_)._M_t.super___uniq_ptr_impl<webrtc::Agc,_std::default_delete<webrtc::Agc>_>._M_t.
  super__Tuple_impl<0UL,_webrtc::Agc_*,_std::default_delete<webrtc::Agc>_>.
  super__Head_base<0UL,_webrtc::Agc_*,_false>._M_head_impl = agc;
  this->gctrl_ = gctrl;
  this->volume_callbacks_ = volume_callbacks;
  this->frames_since_clipped_ = 300;
  this->level_ = 0;
  this->max_level_ = 0xff;
  this->max_compression_gain_ = 0xc;
  this->target_compression_ = 7;
  this->compression_ = 7;
  this->compression_accumulator_ = 7.0;
  this->capture_muted_ = false;
  this->check_volume_on_next_process_ = true;
  this->startup_ = true;
  iVar1 = 0xc;
  if (0xc < startup_min_level) {
    iVar1 = startup_min_level;
  }
  if (0xfe < iVar1) {
    iVar1 = 0xff;
  }
  this->startup_min_level_ = iVar1;
  pDVar2 = (DebugFile *)operator_new(1);
  (this->file_preproc_)._M_t.
  super___uniq_ptr_impl<webrtc::DebugFile,_std::default_delete<webrtc::DebugFile>_>._M_t.
  super__Tuple_impl<0UL,_webrtc::DebugFile_*,_std::default_delete<webrtc::DebugFile>_>.
  super__Head_base<0UL,_webrtc::DebugFile_*,_false>._M_head_impl = pDVar2;
  pDVar2 = (DebugFile *)operator_new(1);
  (this->file_postproc_)._M_t.
  super___uniq_ptr_impl<webrtc::DebugFile,_std::default_delete<webrtc::DebugFile>_>._M_t.
  super__Tuple_impl<0UL,_webrtc::DebugFile_*,_std::default_delete<webrtc::DebugFile>_>.
  super__Head_base<0UL,_webrtc::DebugFile_*,_false>._M_head_impl = pDVar2;
  return;
}

Assistant:

AgcManagerDirect::AgcManagerDirect(Agc* agc,
                                   GainControl* gctrl,
                                   VolumeCallbacks* volume_callbacks,
                                   int startup_min_level)
    : agc_(agc),
      gctrl_(gctrl),
      volume_callbacks_(volume_callbacks),
      frames_since_clipped_(kClippedWaitFrames),
      level_(0),
      max_level_(kMaxMicLevel),
      max_compression_gain_(kMaxCompressionGain),
      target_compression_(kDefaultCompressionGain),
      compression_(target_compression_),
      compression_accumulator_(compression_),
      capture_muted_(false),
      check_volume_on_next_process_(true),  // Check at startup.
      startup_(true),
      startup_min_level_(ClampLevel(startup_min_level)),
      file_preproc_(new DebugFile("agc_preproc.pcm")),
      file_postproc_(new DebugFile("agc_postproc.pcm")) {
}